

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall GameBoard::canPut(GameBoard *this,int color,int blockType)

{
  bool bVar1;
  int o;
  int o_00;
  uint x;
  int y;
  int y_00;
  Tetris t;
  Tetris local_58;
  
  local_58.shape = blockShape[blockType];
  x = 0x14;
  local_58.gameBoard = this;
  local_58.blockType = blockType;
  local_58.color = color;
  do {
    y_00 = 1;
    do {
      o_00 = 0;
      do {
        local_58.blockX = x;
        local_58.blockY = y_00;
        local_58.orientation = o_00;
        bVar1 = Tetris::isValid(&local_58,-1,-1,-1);
        if ((bVar1) && (bVar1 = checkDirectDropTo(this,color,blockType,x,y_00,o_00), bVar1)) {
          return true;
        }
        o_00 = o_00 + 1;
      } while (o_00 != 4);
      y_00 = y_00 + 1;
    } while (y_00 != 0xb);
    bVar1 = x < 2;
    x = x - 1;
    if (bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool GameBoard::canPut(int color, int blockType)
{
    Tetris t(this, blockType, color);
    for (int x = MAPHEIGHT; x >= 1; x--)
        for (int y = 1; y <= MAPWIDTH; y++)
            for (int o = 0; o < 4; o++) {
                t.set(x, y, o);
                if (t.isValid() && checkDirectDropTo(color, blockType, x, y, o))
                    return true;
            }
    return false;
}